

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O2

FT_Error psh_hint_table_init(PSH_Hint_Table table,PS_Hint_Table hints,PS_Mask_Table hint_masks,
                            PS_Mask_Table counter_masks,FT_Memory memory)

{
  FT_UInt FVar1;
  PS_Hint pPVar2;
  PSH_Hint_conflict *ppPVar3;
  PSH_Hint_conflict pPVar4;
  PSH_ZoneRec *pPVar5;
  PS_Mask pPVar6;
  FT_UInt FVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  FT_UInt idx_00;
  FT_UInt idx;
  bool bVar12;
  int local_34 [2];
  FT_Error error;
  
  uVar9 = hints->num_hints;
  ppPVar3 = (PSH_Hint_conflict *)
            ft_mem_realloc((FT_Memory)counter_masks,8,0,(ulong)(uVar9 * 2),(void *)0x0,local_34);
  table->sort = ppPVar3;
  if (local_34[0] == 0) {
    pPVar4 = (PSH_Hint_conflict)
             ft_mem_realloc((FT_Memory)counter_masks,0x30,0,(ulong)uVar9,(void *)0x0,local_34);
    table->hints = pPVar4;
    if (local_34[0] == 0) {
      pPVar5 = (PSH_ZoneRec *)
               ft_mem_realloc((FT_Memory)counter_masks,0x20,0,(ulong)(uVar9 * 2 | 1),(void *)0x0,
                              local_34);
      table->zones = pPVar5;
      if (local_34[0] == 0) {
        table->max_hints = uVar9;
        table->sort_global = table->sort + uVar9;
        table->num_hints = 0;
        table->num_zones = 0;
        table->zone = (PSH_Zone)0x0;
        pPVar4 = table->hints;
        pPVar2 = hints->hints;
        lVar8 = 0;
        uVar10 = uVar9;
        while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
          (&pPVar4->org_pos)[lVar8] = *(FT_Int *)((long)&pPVar2->pos + lVar8);
          (&pPVar4->org_len)[lVar8] = *(FT_Int *)((long)&pPVar2->len + lVar8);
          (&pPVar4->flags)[lVar8] = *(FT_UInt *)((long)&pPVar2->flags + lVar8);
          lVar8 = lVar8 + 0xc;
        }
        if (hint_masks == (PS_Mask_Table)0x0) {
          uVar10 = 0;
        }
        else {
          pPVar6 = hint_masks->masks;
          FVar7 = hint_masks->num_masks;
          table->hint_masks = hint_masks;
          while (bVar12 = FVar7 != 0, FVar7 = FVar7 - 1, bVar12) {
            pbVar11 = pPVar6->bytes;
            FVar1 = pPVar6->num_bits;
            uVar10 = 0;
            uVar9 = 0;
            for (idx_00 = 0; FVar1 != idx_00; idx_00 = idx_00 + 1) {
              if (uVar9 == 0) {
                uVar10 = (uint)*pbVar11;
                pbVar11 = pbVar11 + 1;
                uVar9 = 0x80;
              }
              if ((uVar9 & uVar10) != 0) {
                psh_hint_table_record(table,idx_00);
              }
              uVar9 = uVar9 >> 1;
            }
            pPVar6 = pPVar6 + 1;
          }
          uVar9 = table->max_hints;
          uVar10 = table->num_hints;
        }
        if (uVar10 != uVar9) {
          for (FVar7 = 0; uVar9 != FVar7; FVar7 = FVar7 + 1) {
            psh_hint_table_record(table,FVar7);
          }
        }
      }
    }
  }
  return local_34[0];
}

Assistant:

static FT_Error
  psh_hint_table_init( PSH_Hint_Table  table,
                       PS_Hint_Table   hints,
                       PS_Mask_Table   hint_masks,
                       PS_Mask_Table   counter_masks,
                       FT_Memory       memory )
  {
    FT_UInt   count;
    FT_Error  error;

    FT_UNUSED( counter_masks );


    count = hints->num_hints;

    /* allocate our tables */
    if ( FT_NEW_ARRAY( table->sort,  2 * count     ) ||
         FT_NEW_ARRAY( table->hints,     count     ) ||
         FT_NEW_ARRAY( table->zones, 2 * count + 1 ) )
      goto Exit;

    table->max_hints   = count;
    table->sort_global = table->sort + count;
    table->num_hints   = 0;
    table->num_zones   = 0;
    table->zone        = NULL;

    /* initialize the `table->hints' array */
    {
      PSH_Hint  write = table->hints;
      PS_Hint   read  = hints->hints;


      for ( ; count > 0; count--, write++, read++ )
      {
        write->org_pos = read->pos;
        write->org_len = read->len;
        write->flags   = read->flags;
      }
    }

    /* we now need to determine the initial `parent' stems; first  */
    /* activate the hints that are given by the initial hint masks */
    if ( hint_masks )
    {
      PS_Mask  mask = hint_masks->masks;


      count             = hint_masks->num_masks;
      table->hint_masks = hint_masks;

      for ( ; count > 0; count--, mask++ )
        psh_hint_table_record_mask( table, mask );
    }

    /* finally, do a linear parse in case some hints were left alone */
    if ( table->num_hints != table->max_hints )
    {
      FT_UInt  idx;


      FT_TRACE0(( "psh_hint_table_init: missing/incorrect hint masks\n" ));

      count = table->max_hints;
      for ( idx = 0; idx < count; idx++ )
        psh_hint_table_record( table, idx );
    }

  Exit:
    return error;
  }